

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setTransparency(SlicePlane *this,double newVal)

{
  double local_8;
  
  local_8 = newVal;
  PersistentValue<float>::operator=(&this->transparency,&local_8);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setTransparency(double newVal) {
  transparency = newVal;
  requestRedraw();
}